

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskCorrectBit>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSampleMaskCorrectBit> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  bool bVar1;
  allocator<char> local_29;
  string local_28;
  
  bVar1 = checkForErrorMS(imageMSInfo,dataPerSample,0);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,
               "The bit corresponsing to current gl_SampleID is not set in gl_SampleMaskIn",
               &local_29);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_28);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"Passed",&local_29);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSampleMaskCorrectBit>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																						 const vk::VkImageCreateInfo&						imageRSInfo,
																						 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																						 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	DE_UNREF(imageRSInfo);
	DE_UNREF(dataRS);

	if (checkForErrorMS(imageMSInfo, dataPerSample, 0))
		return tcu::TestStatus::fail("The bit corresponsing to current gl_SampleID is not set in gl_SampleMaskIn");

	return tcu::TestStatus::pass("Passed");
}